

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  ImplicitDependLanguageMap *pIVar9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  cmState *pcVar14;
  string *psVar15;
  _Base_ptr p_Var16;
  cmValue cVar17;
  cmOutputConverter *pcVar18;
  char *extraout_RDX;
  string *tr;
  long lVar19;
  cmLocalUnixMakefileGenerator3 *pcVar20;
  pointer pbVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Rb_tree_header *p_Var22;
  char *pcVar23;
  undefined1 *in_R8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  pointer p;
  size_type __rlen;
  ImplicitDependLanguageMap *__range1;
  pointer pcVar24;
  string *include;
  iterator __first;
  string *path;
  string_view str;
  string_view str_00;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string cidVar;
  undefined1 local_118 [32];
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  _Base_ptr local_d8;
  char *local_d0;
  _Rb_tree_node_base *local_c8;
  cmLocalUnixMakefileGenerator3 *local_c0;
  cmOutputConverter *local_b8;
  ostream *local_b0;
  cmGeneratorTarget *local_a8;
  undefined1 local_a0 [32];
  cmOutputConverter *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Base_ptr local_58;
  string local_50;
  
  local_a8 = target;
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# Consider dependencies only in project.\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_IN_PROJECT_ONLY ",0x22);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_f8 = (undefined1  [8])(local_f0 + 8);
  local_c0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
  psVar8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_f8);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
  bVar6 = cmValue::IsOn((cmValue *)psVar8->_M_string_length,value);
  pcVar23 = "OFF";
  if (bVar6) {
    pcVar23 = "ON";
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,pcVar23,(ulong)bVar6 ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,")\n\n",3);
  if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
    operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
  }
  pIVar9 = GetImplicitDepends_abi_cxx11_(local_c0,local_a8,CMake);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of languages for which implicit dependencies are needed:\n",
             0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n",0x1c);
  p_Var22 = &(pIVar9->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var11 = (pIVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != p_Var22;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (cmakefileStream,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  pcVar20 = local_c0;
  local_b0 = cmakefileStream;
  if ((pIVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (cmakefileStream,"# The set of files for implicit dependencies of each language:\n",
               0x3f);
    p_Var16 = (pIVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = &p_Var22->_M_header;
    if ((_Rb_tree_header *)p_Var16 != p_Var22) {
      local_80 = &(pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_DEPENDS_CHECK_",0x18);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        p_Var13 = p_Var16[2]._M_right;
        local_b8 = (cmOutputConverter *)&p_Var16[2]._M_parent;
        local_c8 = p_Var16;
        if ((cmOutputConverter *)p_Var13 != local_b8) {
          do {
            poVar10 = local_b0;
            p_Var2 = p_Var13[2]._M_parent;
            for (p_Var16 = *(_Base_ptr *)(p_Var13 + 2); p_Var16 != p_Var2; p_Var16 = p_Var16 + 1) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  \"",3);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,*(char **)p_Var16,(long)p_Var16->_M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,*(char **)(p_Var13 + 1),(long)p_Var13[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"\n",2);
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          } while ((cmOutputConverter *)p_Var13 != local_b8);
        }
        cmakefileStream = local_b0;
        std::__ostream_insert<char,std::char_traits<char>>(local_b0,"  )\n",4);
        local_f0._16_8_ = *(undefined8 *)(local_c8 + 1);
        local_f0._8_8_ = local_c8[1]._M_parent;
        local_f8 = (undefined1  [8])0x6;
        local_f0._0_8_ = "CMAKE_";
        local_d8 = (_Base_ptr)0xc;
        local_d0 = "_COMPILER_ID";
        views._M_len = 3;
        views._M_array = (iterator)local_f8;
        cmCatViews_abi_cxx11_(&local_50,views);
        pcVar20 = local_c0;
        psVar8 = (string *)
                 cmMakefile::GetDefinition
                           ((local_c0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile
                            ,&local_50);
        pbVar21 = (pointer)(local_118 + 0x10);
        if ((psVar8 != (string *)0x0) && (psVar8->_M_string_length != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,*(char **)(local_c8 + 1),(long)local_c8[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_COMPILER_ID \"",0xe);
          if (psVar8 == (string *)0x0) {
            psVar8 = &cmValue::Empty_abi_cxx11_;
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
        }
        local_b8 = (cmOutputConverter *)(local_c8 + 1);
        iVar7 = std::__cxx11::string::compare((char *)local_b8);
        if (iVar7 == 0) {
          pcVar1 = (pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
          local_118._0_8_ = pbVar21;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"CMAKE_Fortran_SUBMODULE_SEP","");
          psVar8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_118);
          local_f8 = (undefined1  [8])(local_f0 + 8);
          pcVar24 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar24,pcVar24 + psVar8->_M_string_length);
          if ((pointer)local_118._0_8_ != pbVar21) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          pcVar1 = (pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
          local_a0._0_8_ = local_a0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"CMAKE_Fortran_SUBMODULE_EXT","");
          psVar8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_a0);
          pcVar24 = (psVar8->_M_dataplus)._M_p;
          local_118._0_8_ = pbVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_118,pcVar24,pcVar24 + psVar8->_M_string_length);
          if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_SEP \"",0x21);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,(char *)local_f8,local_f0._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_EXT \"",0x21);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
          if ((pointer)local_118._0_8_ != pbVar21) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
            operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
          }
        }
        local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
        local_f0._8_8_ = (_Base_ptr)0x0;
        local_f0._16_8_ = local_f8 + 8;
        local_d0 = (char *)0x0;
        local_d8 = (_Base_ptr)local_f0._16_8_;
        GetConfigName_abi_cxx11_((string *)local_118,pcVar20);
        defines_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8;
        cmLocalGenerator::GetTargetDefines
                  ((cmLocalGenerator *)pcVar20,local_a8,(string *)local_118,(string *)local_b8,
                   defines_00);
        if ((pointer)local_118._0_8_ != pbVar21) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        if (local_d0 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"# Preprocessor definitions for this target.\n",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_TARGET_DEFINITIONS_",0x1d);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,*(char **)(local_c8 + 1),(long)local_c8[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          for (p_Var11 = (_Rb_tree_node_base *)local_f0._16_8_;
              p_Var11 != (_Rb_tree_node_base *)(local_f8 + 8);
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
            std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
            str._M_str = (char *)0x0;
            str._M_len = *(ulong *)(p_Var11 + 1);
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)local_118,(cmOutputConverter *)p_Var11[1]._M_parent,str,
                       (WrapQuotes)defines_00);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((pointer)local_118._0_8_ != pbVar21) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"# The include file search paths:\n",0x21);
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (cmakefileStream,*(char **)(local_c8 + 1),(long)local_c8[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"_TARGET_INCLUDE_PATH\n",0x15);
        pcVar20 = local_c0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetConfigName_abi_cxx11_((string *)local_118,local_c0);
        in_R8 = local_118;
        cmLocalGenerator::GetIncludeDirectories
                  ((cmLocalGenerator *)pcVar20,&local_78,local_a8,(string *)local_b8,
                   (string *)local_118);
        if ((pointer)local_118._0_8_ != pbVar21) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)local_c0);
        psVar8 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar14);
        pcVar1 = (local_c0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_118._0_8_ = pbVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
        bVar6 = cmMakefile::IsOn(pcVar1,(string *)local_118);
        if ((pointer)local_118._0_8_ != pbVar21) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        path = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar15 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar6) {
          pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)local_c0);
          psVar15 = cmState::GetSourceDirectory_abi_cxx11_(pcVar14);
          pbVar5 = local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_118._8_8_ = (psVar15->_M_dataplus)._M_p;
          local_118._0_8_ = psVar15->_M_string_length;
          local_118._24_8_ = (psVar8->_M_dataplus)._M_p;
          local_118._16_8_ = psVar8->_M_string_length;
          lVar19 = (long)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 7;
          p = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
          local_a0._0_8_ = local_118._0_8_;
          local_a0._8_8_ = local_118._8_8_;
          local_a0._16_8_ = local_118._16_8_;
          local_a0._24_8_ = local_118._24_8_;
          if (0 < lVar19) {
            lVar19 = lVar19 + 1;
            do {
              bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,p);
              __first._M_current = p;
              if (bVar6) goto LAB_005049d9;
              bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,p + 1);
              __first._M_current = p + 1;
              if (bVar6) goto LAB_005049d9;
              bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,p + 2);
              __first._M_current = p + 2;
              if (bVar6) goto LAB_005049d9;
              bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,p + 3);
              __first._M_current = p + 3;
              if (bVar6) goto LAB_005049d9;
              p = p + 4;
              lVar19 = lVar19 + -1;
            } while (1 < lVar19);
          }
          lVar19 = (long)pbVar5 - (long)p >> 5;
          if (lVar19 == 1) {
LAB_005049c5:
            bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                              ((NotInProjectDir *)local_118,p);
            __first._M_current = p;
            if (!bVar6) {
              __first._M_current = pbVar5;
            }
          }
          else if (lVar19 == 2) {
LAB_005049b2:
            bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                              ((NotInProjectDir *)local_118,p);
            __first._M_current = p;
            if (!bVar6) {
              p = p + 1;
              goto LAB_005049c5;
            }
          }
          else {
            __first._M_current = pbVar5;
            if ((lVar19 == 3) &&
               (bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                  ((NotInProjectDir *)local_118,p), __first._M_current = p, !bVar6))
            {
              p = p + 1;
              goto LAB_005049b2;
            }
          }
LAB_005049d9:
          psVar8 = __first._M_current + 1;
          if (psVar8 != pbVar5 && __first._M_current != pbVar5) {
            do {
              bVar6 = anon_unknown.dwarf_20d1231::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_a0,psVar8);
              if (!bVar6) {
                std::__cxx11::string::operator=((string *)__first._M_current,(string *)psVar8);
                __first._M_current = __first._M_current + 1;
              }
              psVar8 = psVar8 + 1;
            } while (psVar8 != pbVar5);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_78,__first,
                     (iterator)
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          path = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          psVar15 = local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; path != psVar15; path = path + 1) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
          cmOutputConverter::MaybeRelativeToTopBinDir((string *)local_118,local_80,path);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
          if ((pointer)local_118._0_8_ != pbVar21) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
        pcVar20 = local_c0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_c8);
      } while (p_Var16 != local_58);
    }
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_118._16_8_ = (pointer)0x0;
    pcVar1 = (pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_f8 = (undefined1  [8])(local_f0 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
    cVar17 = cmMakefile::GetProperty(pcVar1,(string *)local_f8);
    if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
    }
    if (cVar17.Value != (string *)0x0) {
      arg._M_str = ((cVar17.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar17.Value)->_M_string_length;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_118,false);
    }
    local_f8 = (undefined1  [8])(local_f0 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
    cVar17 = cmGeneratorTarget::GetProperty(local_a8,(string *)local_f8);
    if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
    }
    if (cVar17.Value != (string *)0x0) {
      arg_00._M_str = ((cVar17.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar17.Value)->_M_string_length;
      cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_118,false);
    }
    if (local_118._0_8_ != local_118._8_8_) {
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"\nset(CMAKE_INCLUDE_TRANSFORMS\n",0x1e);
      uVar4 = local_118._8_8_;
      if (local_118._0_8_ != local_118._8_8_) {
        pbVar21 = (pointer)local_118._0_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(local_b0,"  ",2);
          str_00._M_str = (char *)0x0;
          str_00._M_len = (size_t)(pbVar21->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)local_f8,(cmOutputConverter *)pbVar21->_M_string_length,str_00,
                     (WrapQuotes)in_R8);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_b0,(char *)local_f8,local_f0._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
            operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
          }
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != (pointer)uVar4);
      }
      cmakefileStream = local_b0;
      std::__ostream_insert<char,std::char_traits<char>>(local_b0,"  )\n",4);
      pcVar20 = local_c0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
  }
  pIVar9 = GetImplicitDepends_abi_cxx11_(pcVar20,local_a8,Compiler);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"\n# The set of dependency files which are needed:\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_DEPENDENCY_FILES\n",0x23);
  p_Var16 = (pIVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = (cmGeneratorTarget *)&(pIVar9->_M_t)._M_impl.super__Rb_tree_header;
  if ((cmGeneratorTarget *)p_Var16 != local_a8) {
    this_00 = &(pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    do {
      p_Var11 = *(_Rb_tree_node_base **)(p_Var16 + 1);
      p_Var13 = p_Var16[1]._M_parent;
      local_c8 = p_Var16;
      if ((p_Var13 == (_Base_ptr)0x6) && (iVar7 = bcmp(p_Var11,"CUSTOM",6), iVar7 == 0)) {
        pcVar18 = (cmOutputConverter *)local_c8[2]._M_right;
        local_80 = (cmOutputConverter *)&local_c8[2]._M_parent;
        cmakefileStream = local_b0;
        if (pcVar18 != local_80) {
          do {
            psVar8 = (string *)(pcVar18->RelativePathTopBinary)._M_dataplus._M_p;
            psVar15 = (string *)(pcVar18->RelativePathTopBinary)._M_string_length;
            local_b8 = pcVar18;
            if (psVar8 != psVar15) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"\" \"",6);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_f8,this_00,&pcVar18->RelativePathTopSource);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (cmakefileStream,(char *)local_f8,local_f0._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"custom\" \"",0xc);
                cmOutputConverter::MaybeRelativeToTopBinDir((string *)local_118,this_00,psVar8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_118._0_8_,local_118._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"\n",2);
                if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                  operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                }
                cmakefileStream = local_b0;
                if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
                  operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
                }
                psVar8 = psVar8 + 1;
              } while (psVar8 != psVar15);
            }
            pcVar18 = (cmOutputConverter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_b8);
          } while (pcVar18 != local_80);
        }
      }
      else {
        pcVar1 = (pcVar20->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_f8 = (undefined1  [8])0x6;
        local_f0._0_8_ = "CMAKE_";
        local_d8 = (_Rb_tree_node_base *)0xf;
        local_d0 = "_DEPFILE_FORMAT";
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_f8;
        local_f0._8_8_ = p_Var13;
        local_f0._16_8_ = p_Var11;
        cmCatViews_abi_cxx11_((string *)local_a0,views_00);
        psVar8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_a0);
        local_118._0_8_ = local_118 + 0x10;
        pcVar24 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar24,pcVar24 + psVar8->_M_string_length);
        cmakefileStream = local_b0;
        p_Var11 = local_c8;
        if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
        pcVar18 = (cmOutputConverter *)p_Var11[2]._M_right;
        local_80 = (cmOutputConverter *)&p_Var11[2]._M_parent;
        if (pcVar18 != local_80) {
          do {
            pcVar24 = (pcVar18->RelativePathTopBinary)._M_dataplus._M_p;
            pcVar3 = (pointer)(pcVar18->RelativePathTopBinary)._M_string_length;
            local_b8 = pcVar18;
            if (pcVar24 != pcVar3) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_b0,*(char **)pcVar24,*(long *)(pcVar24 + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_f8,this_00,&pcVar18->RelativePathTopSource);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_f8,local_f0._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_118._0_8_,local_118._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_a0,this_00,&pcVar18->RelativePathTopSource);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)local_a0._0_8_,local_a0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,".d\"\n",4);
                if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
                  operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
                }
                cmakefileStream = local_b0;
                if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
                  operator_delete((void *)local_f8,(ulong)(local_f0._8_8_ + 1));
                }
                pcVar24 = pcVar24 + 0x20;
              } while (pcVar24 != pcVar3);
            }
            pcVar18 = (cmOutputConverter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_b8);
          } while (pcVar18 != local_80);
        }
        if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_c8);
      pcVar20 = local_c0;
    } while ((cmGeneratorTarget *)p_Var16 != local_a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  // To enable dependencies filtering
  cmakefileStream << "\n"
                  << "# Consider dependencies only in project.\n"
                  << "set(CMAKE_DEPENDS_IN_PROJECT_ONLY "
                  << (cmIsOn(this->Makefile->GetSafeDefinition(
                        "CMAKE_DEPENDS_IN_PROJECT_ONLY"))
                        ? "ON"
                        : "OFF")
                  << ")\n\n";

  auto const& implicitLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::CMake);

  // list the languages
  cmakefileStream << "# The set of languages for which implicit "
                     "dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "  \"" << implicitLang.first << "\"\n";
  }
  cmakefileStream << "  )\n";

  if (!implicitLangs.empty()) {
    // now list the files for each language
    cmakefileStream
      << "# The set of files for implicit dependencies of each language:\n";
    for (auto const& implicitLang : implicitLangs) {
      const auto& lang = implicitLang.first;

      cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << lang << "\n";
      auto const& implicitPairs = implicitLang.second;

      // for each file pair
      for (auto const& implicitPair : implicitPairs) {
        for (auto const& di : implicitPair.second) {
          cmakefileStream << "  \"" << di << "\" ";
          cmakefileStream << "\"" << implicitPair.first << "\"\n";
        }
      }
      cmakefileStream << "  )\n";

      // Tell the dependency scanner what compiler is used.
      std::string cidVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
      cmValue cid = this->Makefile->GetDefinition(cidVar);
      if (cmNonempty(cid)) {
        cmakefileStream << "set(CMAKE_" << lang << "_COMPILER_ID \"" << *cid
                        << "\")\n";
      }

      if (lang == "Fortran") {
        std::string smodSep =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
        std::string smodExt =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_SEP \"" << smodSep
                        << "\")\n";
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_EXT \"" << smodExt
                        << "\")\n";
      }

      // Build a list of preprocessor definitions for the target.
      std::set<std::string> defines;
      this->GetTargetDefines(target, this->GetConfigName(), lang, defines);
      if (!defines.empty()) {
        /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << lang << "\n";
        /* clang-format on */
        for (std::string const& define : defines) {
          cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(define)
                          << "\n";
        }
        cmakefileStream << "  )\n";
      }

      // Target-specific include directories:
      cmakefileStream << "\n"
                      << "# The include file search paths:\n";
      cmakefileStream << "set(CMAKE_" << lang << "_TARGET_INCLUDE_PATH\n";
      std::vector<std::string> includes;

      this->GetIncludeDirectories(includes, target, lang,
                                  this->GetConfigName());
      std::string const& binaryDir = this->GetState()->GetBinaryDirectory();
      if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
        std::string const& sourceDir = this->GetState()->GetSourceDirectory();
        cm::erase_if(includes, ::NotInProjectDir(sourceDir, binaryDir));
      }
      for (std::string const& include : includes) {
        cmakefileStream << "  \"" << this->MaybeRelativeToTopBinDir(include)
                        << "\"\n";
      }
      cmakefileStream << "  )\n";
    }

    // Store include transform rule properties.  Write the directory
    // rules first because they may be overridden by later target rules.
    std::vector<std::string> transformRules;
    if (cmValue xform =
          this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (cmValue xform =
          target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (!transformRules.empty()) {
      cmakefileStream << "\nset(CMAKE_INCLUDE_TRANSFORMS\n";
      for (std::string const& tr : transformRules) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(tr)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }
  }

  auto const& compilerLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::Compiler);

  // list the dependency files managed by the compiler
  cmakefileStream << "\n# The set of dependency files which are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_DEPENDENCY_FILES\n";
  for (auto const& compilerLang : compilerLangs) {
    auto const& compilerPairs = compilerLang.second;
    if (compilerLang.first == "CUSTOM"_s) {
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << R"(  "" ")"
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << R"(" "custom" ")"
                          << this->MaybeRelativeToTopBinDir(src) << "\"\n";
        }
      }
    } else {
      auto depFormat = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", compilerLang.first, "_DEPFILE_FORMAT"));
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << "  \"" << src << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << "\" \"" << depFormat << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << ".d\"\n";
        }
      }
    }
  }
  cmakefileStream << "  )\n";
}